

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

NodeTranslator * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
          (Arena *this,Node *params,ErrorReporter *params_1,Reader *params_2,
          Orphan<capnp::schema::Node> *params_3,bool *params_4)

{
  NodeTranslator *location;
  Node *params_00;
  ErrorReporter *params_1_00;
  Reader *params_2_00;
  Orphan<capnp::schema::Node> *params_3_00;
  bool *params_4_00;
  NodeTranslator *result;
  bool *params_local_4;
  Orphan<capnp::schema::Node> *params_local_3;
  Reader *params_local_2;
  ErrorReporter *params_local_1;
  Node *params_local;
  Arena *this_local;
  
  location = (NodeTranslator *)allocateBytes(this,0xd8,8,true);
  params_00 = fwd<capnp::compiler::Compiler::Node&>(params);
  params_1_00 = fwd<capnp::compiler::ErrorReporter&>(params_1);
  params_2_00 = fwd<capnp::compiler::Declaration::Reader&>(params_2);
  params_3_00 = fwd<capnp::Orphan<capnp::schema::Node>>(params_3);
  params_4_00 = fwd<bool>(params_4);
  ctor<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
            (location,params_00,params_1_00,params_2_00,params_3_00,params_4_00);
  setDestructor(this,location,destroyObject<capnp::compiler::NodeTranslator>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}